

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O0

bool __thiscall Client::Request(Client *this)

{
  bool bVar1;
  time_point local_20;
  Client *local_18;
  Client *this_local;
  
  this->stopped_ = false;
  this->timed_out_ = false;
  local_18 = this;
  local_20.__d.__r =
       (duration)
       std::chrono::
       time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
       ::max();
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_at(&this->deadline_,&local_20);
  CheckDeadline(this);
  bVar1 = Connect(this);
  if (bVar1) {
    bVar1 = Handshake(this);
    if (bVar1) {
      bVar1 = SendRequest(this);
      if (bVar1) {
        this_local._7_1_ = ReadResponse(this);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Client::Request() {
  stopped_ = false;
  timed_out_ = false;

  // Start the persistent actor that checks for deadline expiry.
  deadline_.expires_at(boost::asio::steady_timer::time_point::max());
  CheckDeadline();

  if (!Connect()) {
    return false;
  }

  if (!Handshake()) {
    return false;
  }

  if (!SendRequest()) {
    return false;
  }

  return ReadResponse();
}